

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Relay.cpp
# Opt level: O0

void __thiscall
RenX_RelayPlugin::process_renx_message
          (RenX_RelayPlugin *this,Server *server,upstream_server_info *server_info,string_view line,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokens)

{
  upstream_settings *puVar1;
  bool bVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  value_type *pvVar6;
  char *begin;
  char *pcVar7;
  size_type sVar8;
  reference pvVar9;
  const_reference pvVar10;
  PlayerInfo *pPVar11;
  rep rVar12;
  size_type sVar13;
  deque<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
  *this_00;
  ostream *this_01;
  reference ppuVar14;
  reference pvVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_3;
  __sv_type _Var16;
  string_view sVar17;
  byte local_17b9;
  string_view local_1710;
  string local_1700;
  undefined1 local_16e0 [8];
  string response;
  deque<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
  *queue;
  size_type local_16a0;
  size_t index_2;
  string line_sanitized;
  string local_1668;
  string local_1648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1628;
  undefined8 local_1608;
  HWID hwid;
  uniform_int_distribution<unsigned_long> dist_1;
  undefined1 local_15e8 [8];
  mt19937_64 randgen_1;
  result_type local_c10;
  result_type local_c0c;
  result_type local_c08;
  result_type local_c04;
  char *local_c00;
  undefined8 local_bf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf0;
  uniform_int_distribution<unsigned_int> local_bd0;
  uniform_int_distribution<unsigned_int> dist;
  undefined1 local_bc0 [8];
  mt19937_64 randgen;
  PlayerInfo *player;
  value_type *token_1;
  size_t index_1;
  allocator<char> local_1a9;
  undefined1 local_1a8 [8];
  string replacement_player;
  string_view idToken;
  char local_169;
  undefined1 local_168 [8];
  container_type player_tokens;
  value_type *token;
  size_t index;
  anon_class_8_1_6b262081 findPlayerBySteamID;
  anon_class_8_1_6b262081 findPlayerByHWID;
  anon_class_8_1_6b262081 findPlayerByIP;
  upstream_settings *settings;
  bool required_sanitization;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokens_local;
  upstream_server_info *server_info_local;
  Server *server_local;
  RenX_RelayPlugin *this_local;
  string_view line_local;
  undefined1 local_a8 [16];
  char *local_98;
  undefined8 local_90;
  uint *local_88;
  uint *local_80;
  uint *local_78;
  v8 *local_70;
  char *local_68;
  undefined8 uStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  char **local_50;
  char *local_48;
  undefined8 uStack_40;
  char **local_38;
  undefined1 *local_30;
  char **local_28;
  char **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  line_local._M_len = (size_t)line._M_str;
  this_local = (RenX_RelayPlugin *)line._M_len;
  bVar3 = false;
  args_3 = tokens;
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&server_info->m_socket);
  if (!bVar2) {
    return;
  }
  puVar1 = server_info->m_settings;
  if ((puVar1->m_suppress_chat_logs & 1U) != 0) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](tokens,0);
    bVar2 = std::operator==(pvVar4,"lCHAT");
    if (bVar2) {
      return;
    }
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](tokens,0);
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (pvVar4);
  if (!bVar2) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](tokens,0);
    pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](pvVar4,0);
    if (*pvVar5 != 'r') {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](tokens,0);
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](pvVar4,0);
      if (*pvVar5 != 'c') goto LAB_0018ebff;
    }
    if ((server_info->m_processing_command & 1U) == 0) {
      return;
    }
  }
LAB_0018ebff:
  index = (size_t)server;
  findPlayerBySteamID.server = server;
  findPlayerByHWID.server = server;
  if ((puVar1->m_sanitize_names & 1U) != 0) {
    for (token = (value_type *)0x0;
        pvVar6 = (value_type *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(tokens), token != pvVar6;
        token = (value_type *)((long)&(token->_M_dataplus)._M_p + 1)) {
      player_tokens.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](tokens,(size_type)token);
      begin = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         player_tokens.
                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          player_tokens.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         player_tokens.
                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = is_player_token(begin,pcVar7 + sVar8);
      if (bVar2) {
        local_169 = ',';
        jessilib::
        split_n_view<std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                  ((container_type *)local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   player_tokens.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_169,2);
        pvVar9 = std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator[]((container_type *)local_168,1);
        replacement_player.field_2._8_8_ = pvVar9->_M_len;
        pvVar9 = std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator[]((container_type *)local_168,0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)local_1a8,pvVar9,&local_1a9);
        std::allocator<char>::~allocator(&local_1a9);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   ',');
        std::__cxx11::string::operator+=
                  ((string *)local_1a8,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   ((long)&replacement_player.field_2 + 8));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   ',');
        bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           ((long)&replacement_player.field_2 + 8));
        if ((!bVar3) &&
           (pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::front
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 ((long)&replacement_player.field_2 + 8)), *pvVar10 == 'b')) {
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     ((long)&replacement_player.field_2 + 8),1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "Player");
        std::__cxx11::string::operator+=
                  ((string *)local_1a8,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   ((long)&replacement_player.field_2 + 8));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   player_tokens.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
        bVar3 = true;
        std::__cxx11::string::~string((string *)local_1a8);
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_168);
      }
    }
  }
  if (((puVar1->m_sanitize_ips & 1U) != 0) || ((puVar1->m_sanitize_hwids & 1U) != 0)) {
    for (token_1 = (value_type *)0x0;
        pvVar6 = (value_type *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(tokens), token_1 != pvVar6;
        token_1 = (value_type *)((long)&(token_1->_M_dataplus)._M_p + 1)) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](tokens,(size_type)token_1);
      if ((puVar1->m_sanitize_ips & 1U) == 0) {
LAB_0018f1d4:
        if ((puVar1->m_sanitize_hwids & 1U) != 0) {
          join_0x00000010_0x00000000_ =
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar4);
          pPVar11 = process_renx_message::anon_class_8_1_6b262081::operator()
                              (&findPlayerBySteamID,join_0x00000010_0x00000000_);
          if (pPVar11 != (PlayerInfo *)0x0) {
            dist_1._M_param._M_b =
                 (unsigned_long)
                 std::chrono::
                 time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                 ::time_since_epoch(&this->m_init_time);
            rVar12 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                               ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                &dist_1._M_param._M_b);
            std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::mersenne_twister_engine
                      ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                        *)local_15e8,(long)(pPVar11->id * 2) + 0x45 + rVar12);
            std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
                      ((uniform_int_distribution<unsigned_long> *)&hwid,0,0xffffffffffff);
            local_1608 = 0;
            local_1608 = std::uniform_int_distribution<unsigned_long>::operator()
                                   ((uniform_int_distribution<unsigned_long> *)&hwid,
                                    (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                     *)local_15e8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(pvVar4,"m");
            to_hex<unsigned_int>(&local_1648,(uint)local_1608);
            to_hex<unsigned_int>(&local_1668,local_1608._4_4_);
            std::operator+(&local_1628,&local_1648,&local_1668);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=(pvVar4,&local_1628);
            std::__cxx11::string::~string((string *)&local_1628);
            std::__cxx11::string::~string((string *)&local_1668);
            std::__cxx11::string::~string((string *)&local_1648);
            bVar3 = true;
            goto LAB_0018f430;
          }
        }
        if ((puVar1->m_sanitize_steam_ids & 1U) != 0) {
          join_0x00000010_0x00000000_ =
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar4);
          pPVar11 = process_renx_message::anon_class_8_1_6b262081::operator()
                              ((anon_class_8_1_6b262081 *)&index,join_0x00000010_0x00000000_);
          if (pPVar11 != (PlayerInfo *)0x0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(pvVar4,"0x0000000000000000");
          }
        }
      }
      else {
        std::__cxx11::string::string((string *)&randgen._M_p,pvVar4);
        pPVar11 = process_renx_message::anon_class_8_1_6b262081::operator()
                            (&findPlayerByHWID,(string *)&randgen._M_p);
        std::__cxx11::string::~string((string *)&randgen._M_p);
        if (pPVar11 == (PlayerInfo *)0x0) goto LAB_0018f1d4;
        dist._M_param =
             (param_type)
             std::chrono::
             time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             ::time_since_epoch(&this->m_init_time);
        rVar12 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                           ((duration<long,_std::ratio<1L,_1000000000L>_> *)&dist);
        std::
        mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
        ::mersenne_twister_engine
                  ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                    *)local_bc0,rVar12 + pPVar11->id * 2);
        std::uniform_int_distribution<unsigned_int>::uniform_int_distribution(&local_bd0,10,200);
        local_c00 = "{}.{}.{}.{}";
        local_bf8 = 0xb;
        local_c04 = std::uniform_int_distribution<unsigned_int>::operator()
                              (&local_bd0,
                               (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                *)local_bc0);
        local_c08 = std::uniform_int_distribution<unsigned_int>::operator()
                              (&local_bd0,
                               (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                *)local_bc0);
        local_c0c = std::uniform_int_distribution<unsigned_int>::operator()
                              (&local_bd0,
                               (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                *)local_bc0);
        local_c10 = std::uniform_int_distribution<unsigned_int>::operator()
                              (&local_bd0,
                               (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                *)local_bc0);
        local_58 = &local_bf0;
        local_68 = local_c00;
        uStack_60 = local_bf8;
        local_70 = (v8 *)&local_c04;
        local_78 = &local_c08;
        local_80 = &local_c0c;
        local_88 = &local_c10;
        local_50 = &local_68;
        local_98 = local_c00;
        local_90 = local_bf8;
        local_48 = local_98;
        uStack_40 = local_90;
        fmt::v8::
        make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&>
                  ((format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>
                    *)&line_local._M_str,local_70,local_78,local_80,local_88,(uint *)args_3);
        local_30 = local_a8;
        local_38 = &line_local._M_str;
        local_18 = 0x2222;
        local_28 = local_38;
        local_20 = local_38;
        local_10 = local_30;
        fmt::v8::vformat_abi_cxx11_(&local_bf0,local_98,local_90,0x2222,local_38);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (pvVar4,&local_bf0);
        std::__cxx11::string::~string((string *)&local_bf0);
        bVar3 = true;
      }
LAB_0018f430:
    }
  }
  std::__cxx11::string::string((string *)&index_2);
  if (bVar3) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](tokens,0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index_2,pvVar4)
    ;
    for (local_16a0 = 1;
        sVar13 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(tokens), local_16a0 != sVar13; local_16a0 = local_16a0 + 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index_2,
                 (char)RenX::DelimC);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](tokens,local_16a0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index_2,
                 pvVar4);
    }
  }
  else {
    std::__cxx11::string::operator=
              ((string *)&index_2,(basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index_2,'\n');
  _Var16 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&index_2);
  send_upstream(this,server_info,_Var16,server);
  pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index_2,
                      0);
  sVar17._M_str = local_1710._M_str;
  sVar17._M_len = local_1710._M_len;
  if ((*pvVar5 == 'c') && (local_1710 = sVar17, (server_info->m_processing_command & 1U) != 0)) {
    this_00 = &server_info->m_response_queue;
    server_info->m_processing_command = false;
    bVar3 = std::
            deque<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
            ::empty(this_00);
    if (bVar3) {
      this_01 = std::operator<<((ostream *)&std::cerr,"COMMAND FINISHED PROCESSING ON EMPTY QUEUE");
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      response.field_2._12_4_ = 1;
      goto LAB_0018f835;
    }
    ppuVar14 = std::
               deque<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
               ::front(&this->m_command_tracker);
    if (*ppuVar14 != server_info) {
      __assert_fail("m_command_tracker.front() == &server_info",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Plugins/RenX/RenX.Relay/RenX_Relay.cpp"
                    ,0x21f,
                    "void RenX_RelayPlugin::process_renx_message(RenX::Server &, upstream_server_info &, std::string_view, std::vector<std::string>)"
                   );
    }
    std::
    deque<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>::
    pop_front(this_00);
    std::
    deque<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
    ::pop_front(&this->m_command_tracker);
    std::__cxx11::string::string((string *)local_16e0);
    while( true ) {
      bVar3 = std::
              deque<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
              ::empty(this_00);
      local_17b9 = 0;
      if (!bVar3) {
        pvVar15 = std::
                  deque<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
                  ::front(this_00);
        local_17b9 = pvVar15->m_is_fake;
      }
      if ((local_17b9 & 1) == 0) break;
      pvVar15 = std::
                deque<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
                ::front(this_00);
      sVar17 = get_upstream_rcon_username(this,server_info,server);
      local_1710 = sVar17;
      UpstreamCommand::to_rcon_abi_cxx11_(&local_1700,pvVar15,&local_1710);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_16e0,
                 &local_1700);
      std::__cxx11::string::~string((string *)&local_1700);
      _Var16 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_16e0);
      send_upstream(this,server_info,_Var16,server);
      std::
      deque<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>::
      pop_front(this_00);
    }
    std::__cxx11::string::~string((string *)local_16e0);
  }
  response.field_2._12_4_ = 0;
LAB_0018f835:
  std::__cxx11::string::~string((string *)&index_2);
  return;
}

Assistant:

void RenX_RelayPlugin::process_renx_message(RenX::Server& server, upstream_server_info& server_info, std::string_view line, std::vector<std::string> tokens) {
	bool required_sanitization = false;
	if (!server_info.m_socket) {
		// early out: no upstream RCON session
		return;
	}

	const upstream_settings& settings = *server_info.m_settings;
	if (settings.m_suppress_chat_logs
		&& tokens[0] == "lCHAT") {
		return;
	}

	// Suppress unassociated command responses from going upstream
	if (!tokens[0].empty()
		&& (tokens[0][0] == 'r' || tokens[0][0] == 'c')
		&& !server_info.m_processing_command) {
		// This command response wasn't requested upstream; suppress it
		return;
	}

	auto findPlayerByIP = [&server](std::string in_ip) -> const RenX::PlayerInfo* {
		// Parse into integer so we're doing int comparisons instead of strings
		auto ip32 = Jupiter::Socket::pton4(in_ip.c_str());
		if (ip32 == 0) {
			return nullptr;
		}

		// Search players
		for (const auto& player : server.players) {
			if (player.ip32 == ip32) {
				return &player;
			}
		}

		return nullptr;
	};

	auto findPlayerByHWID = [&server](std::string_view in_hwid) -> const RenX::PlayerInfo* {
		if (in_hwid.empty()) {
			return nullptr;
		}

		for (const auto& player : server.players) {
			if (player.hwid == in_hwid) {
				return &player;
			}
		}

		return nullptr;
	};

	auto findPlayerBySteamID = [&server](std::string_view in_steamid) -> const RenX::PlayerInfo* {
		uint64_t steamid{};
		std::from_chars(in_steamid.data(), in_steamid.data() + in_steamid.size(), steamid);
		if (steamid == 0) {
			return nullptr;
		}

		for (const auto& player : server.players) {
			if (player.steamid == steamid) {
				return &player;
			}
		}

		return nullptr;
	};

	if (settings.m_sanitize_names) {
		for (size_t index = 0; index != tokens.size(); ++index) {
			auto& token = tokens[index];
			if (is_player_token(token.data(), token.data() + token.size())) {
				// Get token pieces
				auto player_tokens = jessilib::split_n_view(token, ',', 2);
				std::string_view idToken = player_tokens[1];

				std::string replacement_player = static_cast<std::string>(player_tokens[0]);
				replacement_player += ',';
				replacement_player += idToken;
				replacement_player += ',';
				if (!idToken.empty() && idToken.front() == 'b') {
					idToken.remove_prefix(1);
				}

				// Name (sanitized)
				replacement_player += "Player";
				replacement_player += idToken;

				token = replacement_player;
				required_sanitization = true;
			}
		}
	}

	if (settings.m_sanitize_ips || settings.m_sanitize_hwids) {
		// It's way too much of a pain to check for command usages, and it's not full-proof either (an alias or similar could be added).
		// So instead, we'll just search all messages for any tokens containing any player's IP or HWID.
		// This isn't terribly efficient, but there's only up to 64 players, so not a huge concern
		for (size_t index = 0; index != tokens.size(); ++index) {
			auto& token = tokens[index];
			const RenX::PlayerInfo* player;
			if (settings.m_sanitize_ips) {
				player = findPlayerByIP(token);
				if (player != nullptr) {
					// Initialize the engine here using the init time, so that player fake IPs will be consistent
					// Also include player ID so we get different IPs between players and for each match
					std::mt19937_64 randgen(m_init_time.time_since_epoch().count() + (player->id * 2));
					std::uniform_int_distribution<uint32_t> dist(10, 200);

					// Replace real IP with fake
					//token.format("%u.%u.%u.%u",
					token = fmt::format("{}.{}.{}.{}",
						static_cast<unsigned int>(dist(randgen)),
						static_cast<unsigned int>(dist(randgen)),
						static_cast<unsigned int>(dist(randgen)),
						static_cast<unsigned int>(dist(randgen)));

					required_sanitization = true;
					continue;
				}
			}

			if (settings.m_sanitize_hwids) {
				player = findPlayerByHWID(token);
				if (player != nullptr) {
					// Initialize the engine here using the init time, so that player fake HWIDs will be consistent
					// Also include player ID so we get different HWIDs between players and for each match
					std::mt19937_64 randgen(m_init_time.time_since_epoch().count() + (player->id * 2 + 69));
					std::uniform_int_distribution<uint64_t> dist(0, 0x0000FFFFFFFFFFFFULL);

					HWID hwid{};
					hwid.hwid = dist(randgen);

					token = "m";
					token += to_hex(hwid.left) + to_hex(hwid.right);

					required_sanitization = true;
					continue;
				}
			}

			if (settings.m_sanitize_steam_ids) {
				player = findPlayerBySteamID(token);
				if (player != nullptr) {
					token = g_blank_steamid;
					continue;
				}
			}

			// More sanitization checks here...
		}
	}

	std::string line_sanitized;
	if (required_sanitization) {
		// Construct line to send and send it
		line_sanitized = tokens[0];
		for (size_t index = 1; index != tokens.size(); ++index) {
			line_sanitized += RenX::DelimC;
			line_sanitized += tokens[index];
		}
	}
	else {
		// Forward line without modification
		line_sanitized = line;
	}

	line_sanitized += '\n';
	send_upstream(server_info, line_sanitized, server);

	if (line_sanitized[0] == 'c'
		&& server_info.m_processing_command) {
		auto& queue = server_info.m_response_queue;
		server_info.m_processing_command = false;

		if (queue.empty()) {
			std::cerr << "COMMAND FINISHED PROCESSING ON EMPTY QUEUE" << std::endl;
			return;
		}

		assert(m_command_tracker.front() == &server_info);

		// We've finished executing a real command; pop it and go through any pending fakes
		queue.pop_front();
		m_command_tracker.pop_front();

		std::string response;
		while (!queue.empty() && queue.front().m_is_fake) {
			response = queue.front().to_rcon(get_upstream_rcon_username(server_info, server));
			send_upstream(server_info, response, server);
			queue.pop_front();
		}
	}
}